

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void Fixpp::
     visitMessage<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>,Fixpp::TypedParsingContext<void>>
               (ParsingContext *context,Context *visitor,StreamCursor *param_3)

{
  impl *this;
  long *plVar1;
  bool bVar2;
  char cVar3;
  pair<bool,_int> pVar4;
  long lVar5;
  ulong uVar6;
  StreamCursor *cursor;
  char *errFmt;
  MessageVisitor<should_visit_message_with_multiple_chars_message_type::Visitor,_DefaultTestRules<Fixpp::v44::Spec::Dictionary>_>
  messageVisitor;
  pair<bool,_std::pair<const_char_*,_unsigned_long>_> beginString;
  pair<bool,_std::pair<const_char_*,_unsigned_long>_> msgType;
  
  this = (impl *)context->cursor;
  impl::matchTag<Fixpp::TagT<8u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
            ((pair<bool,_std::pair<const_char_*,_unsigned_long>_> *)&messageVisitor.visitor,this,
             param_3);
  bVar2 = StreamCursor::advance((StreamCursor *)this,1);
  if (bVar2) {
    pVar4 = impl::matchTag<Fixpp::TagT<9u,Fixpp::Type::Int>,int>((StreamCursor *)this);
    if (((ulong)pVar4 & 1) == 0) {
      plVar1 = *(long **)this;
      if ((plVar1[3] == plVar1[2]) && (lVar5 = (**(code **)(*plVar1 + 0x38))(), lVar5 == 0)) {
        uVar6 = 0x3f;
      }
      else {
        plVar1 = *(long **)this;
        if ((char *)plVar1[2] < (char *)plVar1[3]) {
          cVar3 = *(char *)plVar1[2];
        }
        else {
          cVar3 = (**(code **)(*plVar1 + 0x48))();
        }
        uVar6 = (ulong)(uint)(int)cVar3;
      }
      ParsingContext::setError
                (context,ParsingError,"Could not parse BodyLength, expected int, got \'%c\'",uVar6);
      return;
    }
    bVar2 = StreamCursor::advance((StreamCursor *)this,1);
    if (bVar2) {
      impl::matchTag<Fixpp::TagT<35u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
                ((pair<bool,_std::pair<const_char_*,_unsigned_long>_> *)&beginString.second.second,
                 this,cursor);
      bVar2 = StreamCursor::advance((StreamCursor *)this,1);
      if (bVar2) {
        (context->version).first = (char *)beginString._0_8_;
        (context->version).second = (unsigned_long)beginString.second.first;
        context->bodyLength = pVar4.second;
        (context->msgType).first = (char *)msgType._0_8_;
        (context->msgType).second = (unsigned_long)msgType.second.first;
        messageVisitor.context = visitor;
        impl::
        visitMessage<Fixpp::impl::MessageVisitor<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>,DefaultTestRules<Fixpp::v44::Spec::Dictionary>,Fixpp::TypedParsingContext<void>>
                  (context);
        return;
      }
      errFmt = "Expected Header after MsgType, got EOF";
    }
    else {
      errFmt = "Expected MsgType after BodyLength, got EOF";
    }
  }
  else {
    errFmt = "Expected BodyLength after BeginString, got EOFs";
  }
  ParsingContext::setError(context,Incomplete,errFmt);
  return;
}

Assistant:

void visitMessage(Context& context, Visitor& visitor, Rules rules)
    {
        auto& cursor = context.cursor;
        auto beginString = impl::matchTag<Tag::BeginString>(cursor);

        TRY_ADVANCE("Expected BodyLength after BeginString, got EOFs");

        auto bodyLength = impl::matchTag<Tag::BodyLength>(cursor);
        if (!bodyLength.first)
        {
            context.setError(ErrorKind::ParsingError,
                             "Could not parse BodyLength, expected int, got '%c'",
                              CURSOR_CURRENT(cursor));
            return;
        }

        TRY_ADVANCE("Expected MsgType after BodyLength, got EOF");
        auto msgType = impl::matchTag<Tag::MsgType>(cursor);
        TRY_ADVANCE("Expected Header after MsgType, got EOF");

        context.setVersion(beginString.second);
        context.setBodyLength(bodyLength.second);
        context.setMsgType(msgType.second);

        impl::MessageVisitor<Visitor, Rules> messageVisitor(context, visitor);
        impl::visitMessage(context, messageVisitor, rules);
    }